

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_OneLeak_Test::testBody(TEST_MemoryLeakDetectorTest_OneLeak_Test *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  UtestShell *pUVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  SimpleString output;
  SimpleString local_40;
  SimpleString local_30;
  
  pcVar2 = MemoryLeakDetector::allocMemory
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      &((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)
                       ->super_TestMemoryAllocator,3,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pcVar3 = MemoryLeakDetector::report
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      mem_leak_period_checking);
  SimpleString::SimpleString(&local_40,pcVar3);
  pUVar4 = UtestShell::getCurrent();
  pcVar3 = SimpleString::asCharString(&local_40);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,"Memory leak(s) found",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x89);
  pUVar4 = UtestShell::getCurrent();
  pcVar3 = SimpleString::asCharString(&local_40);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,"size: 3",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x8a);
  pUVar4 = UtestShell::getCurrent();
  pcVar3 = SimpleString::asCharString(&local_40);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,"alloc",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x8b);
  pUVar4 = UtestShell::getCurrent();
  StringFromFormat((char *)&local_30,"%p",pcVar2);
  pcVar3 = SimpleString::asCharString(&local_30);
  pcVar5 = SimpleString::asCharString(&local_40);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,pcVar3,pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x8c);
  SimpleString::~SimpleString(&local_30);
  pUVar4 = UtestShell::getCurrent();
  pcVar3 = SimpleString::asCharString(&local_40);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,"Total number of leaks",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x8d);
  (*PlatformSpecificFree)(pcVar2);
  pUVar4 = UtestShell::getCurrent();
  iVar1 = *(int *)&(((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->
                   super_TestMemoryAllocator).field_0x24;
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,1,(long)iVar1,"LONGS_EQUAL(1, testAllocator->alloc_called) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x8f,pTVar6);
  pUVar4 = UtestShell::getCurrent();
  iVar1 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->free_called;
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,0,(long)iVar1,"LONGS_EQUAL(0, testAllocator->free_called) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x90,pTVar6);
  SimpleString::~SimpleString(&local_40);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeak)
{
    char* mem = detector->allocMemory(testAllocator, 3);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    STRCMP_CONTAINS("Memory leak(s) found", output.asCharString());
    STRCMP_CONTAINS("size: 3", output.asCharString());
    STRCMP_CONTAINS("alloc", output.asCharString());
    STRCMP_CONTAINS(StringFromFormat("%p", (void*) mem).asCharString(), output.asCharString());
    STRCMP_CONTAINS("Total number of leaks", output.asCharString());
    PlatformSpecificFree(mem);
    LONGS_EQUAL(1, testAllocator->alloc_called);
    LONGS_EQUAL(0, testAllocator->free_called);
}